

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,String *type,
          int template_id)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  String local_48;
  
  (this->super_TestCaseData).m_file.field_0.buf[0] = '\0';
  (this->super_TestCaseData).m_file.field_0.buf[0x17] = '\x17';
  (this->m_type).field_0.buf[0] = '\0';
  (this->m_type).field_0.buf[0x17] = '\x17';
  (this->m_full_name).field_0.buf[0] = '\0';
  (this->m_full_name).field_0.buf[0x17] = '\x17';
  String::String(&local_48,file);
  String::operator=((String *)this,&local_48);
  String::~String(&local_48);
  (this->super_TestCaseData).m_line = line;
  (this->super_TestCaseData).m_name = (char *)0x0;
  pcVar1 = test_suite->m_description;
  (this->super_TestCaseData).m_test_suite = test_suite->m_test_suite;
  (this->super_TestCaseData).m_description = pcVar1;
  bVar2 = test_suite->m_no_breaks;
  bVar3 = test_suite->m_no_output;
  bVar4 = test_suite->m_may_fail;
  (this->super_TestCaseData).m_skip = test_suite->m_skip;
  (this->super_TestCaseData).m_no_breaks = bVar2;
  (this->super_TestCaseData).m_no_output = bVar3;
  (this->super_TestCaseData).m_may_fail = bVar4;
  (this->super_TestCaseData).m_should_fail = test_suite->m_should_fail;
  (this->super_TestCaseData).m_expected_failures = test_suite->m_expected_failures;
  (this->super_TestCaseData).m_timeout = test_suite->m_timeout;
  this->m_test = test;
  String::operator=(&this->m_type,type);
  this->m_template_id = template_id;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const String& type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }